

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# process.cpp
# Opt level: O0

BOOL GetExitCodeProcess(HANDLE hProcess,LPDWORD lpExitCode)

{
  PROCESS_STATE local_2c;
  DWORD local_28;
  PROCESS_STATE ps;
  DWORD dwExitCode;
  PAL_ERROR palError;
  CPalThread *pThread;
  LPDWORD lpExitCode_local;
  HANDLE hProcess_local;
  
  ps = PS_IDLE;
  pThread = (CPalThread *)lpExitCode;
  lpExitCode_local = (LPDWORD)hProcess;
  if (!PAL_InitializeChakraCoreCalled) {
    abort();
  }
  _dwExitCode = CorUnix::InternalGetCurrentThread();
  if (pThread == (CPalThread *)0x0) {
    if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
      abort();
    }
    ps = 0x57;
  }
  else {
    ps = PROCGetProcessStatus(_dwExitCode,lpExitCode_local,&local_2c,&local_28);
    if (ps == PS_IDLE) {
      if (local_2c == PS_DONE) {
        *(DWORD *)&pThread->_vptr_CPalThread = local_28;
      }
      else {
        *(undefined4 *)&pThread->_vptr_CPalThread = 0x103;
      }
    }
    else {
      fprintf(_stderr,"] %s %s:%d","GetExitCodeProcess",
              "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/thread/process.cpp"
              ,0x445);
      fprintf(_stderr,"Couldn\'t get process status information!\n");
    }
  }
  if (ps != PS_IDLE) {
    CorUnix::CPalThread::SetLastError(ps);
  }
  if ((PAL_InitializeChakraCoreCalled & 1U) != 0) {
    return (BOOL)(ps == PS_IDLE);
  }
  abort();
}

Assistant:

BOOL
PALAPI
GetExitCodeProcess(
    IN HANDLE hProcess,
    IN LPDWORD lpExitCode)
{
    CPalThread *pThread;
    PAL_ERROR palError = NO_ERROR;
    DWORD dwExitCode;
    PROCESS_STATE ps;

    PERF_ENTRY(GetExitCodeProcess);
    ENTRY("GetExitCodeProcess(hProcess = %p, lpExitCode = %p)\n",
          hProcess, lpExitCode);

    pThread = InternalGetCurrentThread();

    if(NULL == lpExitCode)
    {
        WARN("Got NULL lpExitCode\n");
        palError = ERROR_INVALID_PARAMETER;
        goto done;
    }

    palError = PROCGetProcessStatus(
        pThread,
        hProcess,
        &ps,
        &dwExitCode
        );

    if (NO_ERROR != palError)
    {
        ASSERT("Couldn't get process status information!\n");
        goto done;
    }

    if( PS_DONE == ps )
    {
        *lpExitCode = dwExitCode;
    }
    else
    {
        *lpExitCode = STILL_ACTIVE;
    }

done:

    if (NO_ERROR != palError)
    {
        pThread->SetLastError(palError);
    }

    LOGEXIT("GetExitCodeProcess returns BOOL %d\n", NO_ERROR == palError);
    PERF_EXIT(GetExitCodeProcess);

    return NO_ERROR == palError;
}